

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffsetNonOneof
          (ReflectionSchema *this,FieldDescriptor *field)

{
  long lVar1;
  Type type;
  uint32 uVar2;
  char *pcVar3;
  int in_EDX;
  FieldDescriptor *in_RSI;
  long in_RDI;
  FieldDescriptor *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_RDI + 8);
  pcVar3 = FieldDescriptor::index(in_RSI,(char *)in_RSI,in_EDX);
  uVar2 = *(uint32 *)(lVar1 + (long)(int)pcVar3 * 4);
  type = FieldDescriptor::type(in_stack_ffffffffffffff90);
  uVar2 = OffsetValue(uVar2,type);
  return uVar2;
}

Assistant:

uint32 GetFieldOffsetNonOneof(const FieldDescriptor* field) const {
    GOOGLE_DCHECK(!field->containing_oneof());
    return OffsetValue(offsets_[field->index()], field->type());
  }